

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso8859_15.h
# Opt level: O0

int iso8859_15_wctomb(void *conv,uchar *r,uint wc,int n)

{
  uchar uVar1;
  uchar local_29;
  uchar c;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  local_29 = '\0';
  if (wc < 0xa0) {
    *r = (uchar)wc;
    conv_local._4_4_ = 1;
  }
  else {
    if ((wc < 0xa0) || (0xbf < wc)) {
      if ((wc < 0xc0) || (uVar1 = (uchar)wc, 0xff < wc)) {
        if ((wc < 0x150) || (0x17f < wc)) {
          uVar1 = local_29;
          if (wc == 0x20ac) {
            local_29 = 0xa4;
            uVar1 = local_29;
          }
        }
        else {
          uVar1 = ""[wc - 0x150];
        }
      }
    }
    else {
      uVar1 = iso8859_15_page00[wc - 0xa0];
    }
    local_29 = uVar1;
    if (local_29 == '\0') {
      conv_local._4_4_ = -1;
    }
    else {
      *r = local_29;
      conv_local._4_4_ = 1;
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int
iso8859_15_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  unsigned char c = 0;
  if (wc < 0x00a0) {
    *r = wc;
    return 1;
  }
  else if (wc >= 0x00a0 && wc < 0x00c0)
    c = iso8859_15_page00[wc-0x00a0];
  else if (wc >= 0x00c0 && wc < 0x0100)
    c = wc;
  else if (wc >= 0x0150 && wc < 0x0180)
    c = iso8859_15_page01[wc-0x0150];
  else if (wc == 0x20ac)
    c = 0xa4;
  if (c != 0) {
    *r = c;
    return 1;
  }
  return RET_ILSEQ;
}